

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_reduce.cpp
# Opt level: O2

void duckdb::LambdaFunctions::ListReduceFunction
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  pointer __p;
  unsigned_long *puVar1;
  ClientContext *context;
  Allocator *pAVar2;
  Expression *pEVar3;
  ulong uVar4;
  reference pvVar5;
  pointer pVVar6;
  type pVVar7;
  Vector *pVVar8;
  reference pvVar9;
  pointer this;
  DataChunk *pDVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t index;
  long lVar14;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  idx_t reduced_row_idx;
  bool completed;
  ulong local_338;
  DataChunk *local_330;
  ulong local_328;
  pointer local_320;
  SelectionVector right_sel;
  vector<duckdb::Vector,_true> slices;
  LambdaInfo info;
  ReduceExecuteInfo execute_info;
  Vector right_slice;
  DataChunk input_chunk;
  DataChunk even_result_chunk;
  Vector index_vector;
  DataChunk odd_result_chunk;
  
  completed = false;
  LambdaInfo::LambdaInfo(&info,args,state,result,&completed);
  if (completed == false) {
    context = ExpressionState::GetContext(state);
    ReduceExecuteInfo::ReduceExecuteInfo(&execute_info,&info,context);
    DataChunk::DataChunk(&odd_result_chunk);
    pAVar2 = Allocator::DefaultAllocator();
    pEVar3 = optional_ptr<duckdb::Expression,_true>::operator->(&info.lambda_expr);
    LogicalType::LogicalType((LogicalType *)&right_slice,&pEVar3->return_type);
    __l._M_len = 1;
    __l._M_array = (iterator)&right_slice;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&index_vector,
               __l,(allocator_type *)&input_chunk);
    DataChunk::Initialize
              (&odd_result_chunk,pAVar2,(vector<duckdb::LogicalType,_true> *)&index_vector,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&index_vector);
    LogicalType::~LogicalType((LogicalType *)&right_slice);
    DataChunk::DataChunk(&even_result_chunk);
    pAVar2 = Allocator::DefaultAllocator();
    pEVar3 = optional_ptr<duckdb::Expression,_true>::operator->(&info.lambda_expr);
    LogicalType::LogicalType((LogicalType *)&right_slice,&pEVar3->return_type);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&right_slice;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&index_vector,
               __l_00,(allocator_type *)&input_chunk);
    DataChunk::Initialize
              (&even_result_chunk,pAVar2,(vector<duckdb::LogicalType,_true> *)&index_vector,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&index_vector);
    LogicalType::~LogicalType((LogicalType *)&right_slice);
    local_338 = 0;
    uVar4 = 0;
    while (puVar1 = execute_info.active_rows.super_TemplatedValidityMask<unsigned_long>.
                    validity_mask, (uVar4 & 1) == 0) {
      local_330 = &odd_result_chunk;
      if ((local_338 & 1) == 0) {
        local_330 = &even_result_chunk;
      }
      reduced_row_idx = 0;
      uVar13 = execute_info.initial_value_offset + local_338;
      right_sel.sel_vector = (sel_t *)0x0;
      right_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      right_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      SelectionVector::Initialize(&right_sel,info.row_count);
      uVar11 = 0;
      lVar14 = 0;
      index = 0;
      uVar12 = 0;
      uVar4 = info.row_count;
      while (uVar12 < uVar4) {
        local_328 = uVar11;
        if (puVar1[lVar14] == 0) {
          uVar12 = uVar12 + 0x40;
        }
        else {
          for (; uVar11 < uVar4; uVar11 = uVar11 + 1) {
            if ((execute_info.active_rows.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 == (unsigned_long *)0x0) ||
               ((execute_info.active_rows.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)) {
              uVar4 = uVar12;
              if ((info.list_column_format.sel)->sel_vector != (sel_t *)0x0) {
                uVar4 = (ulong)(info.list_column_format.sel)->sel_vector[uVar12];
              }
              if (uVar13 < info.list_entries[uVar4].length) {
                right_sel.sel_vector[reduced_row_idx] =
                     (int)info.list_entries[uVar4].offset + (int)uVar13;
                execute_info.left_sel.sel_vector[reduced_row_idx] = (sel_t)index;
                execute_info.active_rows_sel.sel_vector[reduced_row_idx] = (sel_t)uVar12;
                reduced_row_idx = reduced_row_idx + 1;
              }
              else {
                if ((uVar13 == 0 & info.has_initial & info.list_entries[uVar4].length == 0) == 1) {
                  TemplatedValidityMask<unsigned_long>::SetInvalid
                            ((TemplatedValidityMask<unsigned_long> *)&execute_info,uVar12);
                  pvVar5 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::get<true>
                                     (&info.column_infos,0);
                  Vector::GetValue((Value *)&index_vector,(pvVar5->vector)._M_data,uVar12);
                  Vector::SetValue(info.result,uVar12,(Value *)&index_vector);
                }
                else {
                  TemplatedValidityMask<unsigned_long>::SetInvalid
                            ((TemplatedValidityMask<unsigned_long> *)&execute_info,uVar12);
                  pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                           operator->(&execute_info.left_slice);
                  Vector::GetValue((Value *)&index_vector,pVVar6,index);
                  Vector::SetValue(info.result,uVar12,(Value *)&index_vector);
                }
                Value::~Value((Value *)&index_vector);
              }
              index = index + 1;
              uVar4 = info.row_count;
            }
            uVar12 = uVar12 + 1;
          }
        }
        lVar14 = lVar14 + 1;
        uVar11 = local_328 + 0x40;
      }
      local_328 = CONCAT71((int7)(uVar4 >> 8),reduced_row_idx == 0);
      if (reduced_row_idx != 0) {
        Value::BIGINT((Value *)&right_slice,uVar13 + 1);
        Vector::Vector(&index_vector,(Value *)&right_slice);
        Value::~Value((Value *)&right_slice);
        pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                           (&execute_info.left_slice);
        pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (&execute_info.left_slice);
        Vector::Slice(pVVar6,pVVar7,&execute_info.left_sel,reduced_row_idx);
        pVVar8 = optional_ptr<duckdb::Vector,_true>::operator*(&info.child_vector);
        Vector::Vector(&right_slice,pVVar8,&right_sel,reduced_row_idx);
        DataChunk::DataChunk(&input_chunk);
        DataChunk::InitializeEmpty(&input_chunk,&execute_info.input_types);
        input_chunk.count = reduced_row_idx;
        uVar4 = (ulong)info.has_index;
        if (uVar4 == 1) {
          pvVar9 = vector<duckdb::Vector,_true>::get<true>(&input_chunk.data,0);
          Vector::Reference(pvVar9,&index_vector);
        }
        if ((local_338 == 0) && (info.has_initial == true)) {
          pvVar5 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::get<true>
                             (&info.column_infos,0);
          Vector::Slice((pvVar5->vector)._M_data,&execute_info.active_rows_sel,reduced_row_idx);
          pvVar9 = vector<duckdb::Vector,_true>::get<true>(&input_chunk.data,uVar4 + 1);
          pvVar5 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::get<true>
                             (&info.column_infos,0);
          pVVar8 = (pvVar5->vector)._M_data;
        }
        else {
          pvVar9 = vector<duckdb::Vector,_true>::get<true>(&input_chunk.data,uVar4 + 1);
          pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                             (&execute_info.left_slice);
        }
        Vector::Reference(pvVar9,pVVar8);
        pvVar9 = vector<duckdb::Vector,_true>::get<true>(&input_chunk.data,uVar4);
        Vector::Reference(pvVar9,&right_slice);
        slices.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        slices.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        slices.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar11 = (ulong)info.has_initial;
        for (uVar12 = 0;
            uVar12 < ((long)info.column_infos.
                            super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                            .
                            super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)info.column_infos.
                           super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                           .
                           super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x68 - uVar11;
            uVar12 = uVar12 + 1) {
          pvVar5 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::get<true>
                             (&info.column_infos,uVar12);
          if (((pvVar5->vector)._M_data)->vector_type == CONSTANT_VECTOR) {
            pvVar9 = vector<duckdb::Vector,_true>::get<true>(&input_chunk.data,uVar12 + (uVar4 | 2))
            ;
            pvVar5 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::get<true>
                               (&info.column_infos,uVar11 + uVar12);
            pVVar8 = (pvVar5->vector)._M_data;
          }
          else {
            pvVar5 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::get<true>
                               (&info.column_infos,uVar11 + uVar12);
            ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
            emplace_back<std::reference_wrapper<duckdb::Vector>&,duckdb::SelectionVector&,unsigned_long&>
                      ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&slices,
                       &pvVar5->vector,&execute_info.active_rows_sel,&reduced_row_idx);
            pvVar9 = vector<duckdb::Vector,_true>::get<true>(&input_chunk.data,uVar12 + (uVar4 | 2))
            ;
            pVVar8 = vector<duckdb::Vector,_true>::back(&slices);
          }
          Vector::Reference(pvVar9,pVVar8);
        }
        DataChunk::Reset(local_330);
        pDVar10 = &odd_result_chunk;
        if ((local_338 & 1) == 0) {
          pDVar10 = &even_result_chunk;
        }
        pDVar10->count = reduced_row_idx;
        this = unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
               ::operator->(&execute_info.expr_executor);
        ExpressionExecutor::Execute(this,&input_chunk,local_330);
        pvVar9 = vector<duckdb::Vector,_true>::get<true>(&local_330->data,0);
        make_uniq<duckdb::Vector,duckdb::LogicalType_const&,unsigned_long&>
                  ((duckdb *)&local_320,&pvVar9->type,&reduced_row_idx);
        __p = local_320;
        local_320 = (pointer)0x0;
        ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
                  ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)
                   &execute_info.left_slice,__p);
        ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&local_320);
        pvVar9 = vector<duckdb::Vector,_true>::get<true>(&local_330->data,0);
        pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (&execute_info.left_slice);
        VectorOperations::Copy(pvVar9,pVVar7,reduced_row_idx,0,0);
        ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::~vector
                  (&slices.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>);
        DataChunk::~DataChunk(&input_chunk);
        Vector::~Vector(&right_slice);
        Vector::~Vector(&index_vector);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&right_sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      uVar4 = local_338;
      pDVar10 = &even_result_chunk;
      if ((local_338 & 1) == 0) {
        pDVar10 = &odd_result_chunk;
      }
      DataChunk::Reset(pDVar10);
      local_338 = uVar4 + 1;
      uVar4 = local_328;
    }
    if ((info.is_all_constant == true) && (info.is_volatile == false)) {
      Vector::SetVectorType(info.result,CONSTANT_VECTOR);
    }
    DataChunk::~DataChunk(&even_result_chunk);
    DataChunk::~DataChunk(&odd_result_chunk);
    ReduceExecuteInfo::~ReduceExecuteInfo(&execute_info);
  }
  LambdaInfo::~LambdaInfo(&info);
  return;
}

Assistant:

void LambdaFunctions::ListReduceFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	// Initializes the left slice from the list entries, active rows, the expression executor and the input types
	bool completed = false;
	LambdaInfo info(args, state, result, completed);
	if (completed) {
		return;
	}

	ReduceExecuteInfo execute_info(info, state.GetContext());

	// Since the left slice references the result chunk, we need to create two result chunks.
	// This means there is always an empty result chunk for the next iteration,
	// without the referenced chunk having to be reset until the current iteration is complete.
	DataChunk odd_result_chunk;
	odd_result_chunk.Initialize(Allocator::DefaultAllocator(), {info.lambda_expr->return_type});

	DataChunk even_result_chunk;
	even_result_chunk.Initialize(Allocator::DefaultAllocator(), {info.lambda_expr->return_type});

	// Execute reduce until all rows are finished.
	idx_t loops = 0;
	bool end = false;
	while (!end) {
		auto &result_chunk = loops % 2 ? odd_result_chunk : even_result_chunk;
		auto &spare_result_chunk = loops % 2 ? even_result_chunk : odd_result_chunk;

		end = ExecuteReduce(loops, execute_info, info, result_chunk);
		spare_result_chunk.Reset();
		loops++;
	}

	if (info.is_all_constant && !info.is_volatile) {
		info.result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}